

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# layout.c++
# Opt level: O0

ListReader *
capnp::_::WireHelpers::readListPointer
          (ListReader *__return_storage_ptr__,SegmentReader *segment,CapTableReader *capTable,
          WirePointer *ref,word *refTarget,word *defaultValue,ElementSize expectedElementSize,
          int nestingLimit,bool checkElementSize)

{
  WirePointer *capTable_00;
  CapTableReader *segment_00;
  bool bVar1;
  ElementSize elementSize_00;
  ElementSize EVar2;
  unsigned_short uVar3;
  unsigned_short structPointerCount;
  Kind KVar4;
  WordCountN<29> WVar5;
  ListElementCount i;
  WordCountN<17> WVar6;
  BitsPerElementTableType structDataSize;
  PointersPerElementN<1> PVar7;
  ElementCountN<29> i_00;
  uint step_00;
  BitsPerElementTableType BVar8;
  PointersPerElementN<1> PVar9;
  WirePointer *this;
  unsigned_long uVar10;
  WordCount64 WVar11;
  Fault local_110;
  Fault f_13;
  Fault f_12;
  WirePointerCount expectedPointersPerElement;
  BitCount expectedDataBitsPerElement;
  Fault f_11;
  Fault f_10;
  Fault f_9;
  WordCount64 wordCount_1;
  uint step;
  ElementCountN<29> elementCount;
  uint pointerCount;
  uint dataSize;
  Fault f_8;
  Fault f_7;
  Fault f_6;
  Fault f_5;
  Fault f_4;
  uint wordsPerElement;
  ListElementCount size;
  Fault f_3;
  Fault f_2;
  WirePointer *tag;
  WordCountN<29> wordCount;
  ElementSize elementSize;
  Fault f_1;
  word *p;
  word *ptr;
  Fault local_48;
  Fault f;
  WirePointer *pWStack_38;
  bool checkElementSize_local;
  word *defaultValue_local;
  word *refTarget_local;
  WirePointer *ref_local;
  CapTableReader *capTable_local;
  SegmentReader *segment_local;
  
  f.exception._7_1_ = checkElementSize;
  refTarget_local = (word *)ref;
  ref_local = (WirePointer *)capTable;
  capTable_local = (CapTableReader *)segment;
  bVar1 = WirePointer::isNull(ref);
  pWStack_38 = (WirePointer *)defaultValue;
  defaultValue_local = refTarget;
  if (bVar1) goto LAB_00348a4e;
  do {
    if (nestingLimit < 1) {
      kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[76]>
                (&local_48,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/layout.c++"
                 ,0x8c3,FAILED,"nestingLimit > 0",
                 "\"Message is too deeply-nested or contains cycles.  See capnp::ReaderOptions.\"",
                 (char (*) [76])
                 "Message is too deeply-nested or contains cycles.  See capnp::ReaderOptions.");
      kj::_::Debug::Fault::~Fault(&local_48);
      goto LAB_00348a4e;
    }
    f_1.exception =
         (Exception *)
         followFars((WirePointer **)&refTarget_local,defaultValue_local,
                    (SegmentReader **)&capTable_local);
    this = (WirePointer *)kj::_::readMaybe<capnp::word_const>((Maybe<const_capnp::word_&> *)&f_1);
    if (this == (WirePointer *)0x0) goto LAB_00348a4e;
    KVar4 = WirePointer::kind((WirePointer *)refTarget_local);
    if (KVar4 != LIST) {
      kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[67]>
                ((Fault *)&wordCount,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/layout.c++"
                 ,0x8cf,FAILED,"ref->kind() == WirePointer::LIST",
                 "\"Message contains non-list pointer where list pointer was expected.\"",
                 (char (*) [67])"Message contains non-list pointer where list pointer was expected."
                );
      kj::_::Debug::Fault::~Fault((Fault *)&wordCount);
      goto LAB_00348a4e;
    }
    elementSize_00 =
         WirePointer::ListRef::elementSize((ListRef *)((long)&refTarget_local->content + 4));
    if (elementSize_00 != INLINE_COMPOSITE) {
      EVar2 = WirePointer::ListRef::elementSize((ListRef *)((long)&refTarget_local->content + 4));
      structDataSize = dataBitsPerElement(EVar2);
      EVar2 = WirePointer::ListRef::elementSize((ListRef *)((long)&refTarget_local->content + 4));
      PVar7 = pointersPerElement(EVar2);
      i_00 = WirePointer::ListRef::elementCount((ListRef *)((long)&refTarget_local->content + 4));
      step_00 = structDataSize + PVar7 * 0x40;
      uVar10 = upgradeBound<unsigned_long,unsigned_int>(i_00);
      WVar11 = roundBitsUpToWords(uVar10 * step_00);
      bVar1 = boundsCheck((SegmentReader *)capTable_local,(word *)this,(WordCountN<31>)WVar11);
      if (bVar1) {
        if ((elementSize_00 != VOID) ||
           (bVar1 = amplifiedRead((SegmentReader *)capTable_local,i_00), bVar1)) {
          if ((f.exception._7_1_ & 1) == 0) {
LAB_003491f8:
            ListReader::ListReader
                      (__return_storage_ptr__,(SegmentReader *)capTable_local,
                       (CapTableReader *)ref_local,this,i_00,step_00,structDataSize,
                       (StructPointerCount)PVar7,elementSize_00,nestingLimit + -1);
            return __return_storage_ptr__;
          }
          if ((elementSize_00 == BIT) && (expectedElementSize != BIT)) {
            kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[106]>
                      ((Fault *)&expectedPointersPerElement,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/layout.c++"
                       ,0x945,FAILED,(char *)0x0,
                       "\"Found bit list where struct list was expected; upgrading boolean lists to structs \" \"is no longer supported.\""
                       ,(char (*) [106])
                        "Found bit list where struct list was expected; upgrading boolean lists to structs is no longer supported."
                      );
            kj::_::Debug::Fault::~Fault((Fault *)&expectedPointersPerElement);
          }
          else {
            BVar8 = dataBitsPerElement(expectedElementSize);
            PVar9 = pointersPerElement(expectedElementSize);
            if (structDataSize < BVar8) {
              kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[55]>
                        (&f_13,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/layout.c++"
                         ,0x955,FAILED,"expectedDataBitsPerElement <= dataSize",
                         "\"Message contained list with incompatible element type.\"",
                         (char (*) [55])"Message contained list with incompatible element type.");
              kj::_::Debug::Fault::~Fault(&f_13);
            }
            else {
              if (PVar9 <= PVar7) goto LAB_003491f8;
              kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[55]>
                        (&local_110,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/layout.c++"
                         ,0x959,FAILED,"expectedPointersPerElement <= pointerCount",
                         "\"Message contained list with incompatible element type.\"",
                         (char (*) [55])"Message contained list with incompatible element type.");
              kj::_::Debug::Fault::~Fault(&local_110);
            }
          }
        }
        else {
          kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[41]>
                    (&f_11,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/layout.c++"
                     ,0x93c,FAILED,"amplifiedRead(segment, elementCount * (ONE * WORDS / ELEMENTS))"
                     ,"\"Message contains amplified list pointer.\"",
                     (char (*) [41])"Message contains amplified list pointer.");
          kj::_::Debug::Fault::~Fault(&f_11);
        }
      }
      else {
        kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[45]>
                  (&f_10,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/layout.c++"
                   ,0x934,FAILED,"boundsCheck(segment, ptr, wordCount)",
                   "\"Message contains out-of-bounds list pointer.\"",
                   (char (*) [45])"Message contains out-of-bounds list pointer.");
        kj::_::Debug::Fault::~Fault(&f_10);
      }
      goto LAB_00348a4e;
    }
    WVar5 = WirePointer::ListRef::inlineCompositeWordCount
                      ((ListRef *)((long)&refTarget_local->content + 4));
    bVar1 = boundsCheck((SegmentReader *)capTable_local,(word *)this,WVar5 + 1);
    if (!bVar1) {
      kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[45]>
                (&f_3,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/layout.c++"
                 ,0x8db,FAILED,"boundsCheck(segment, ptr, wordCount + POINTER_SIZE_IN_WORDS)",
                 "\"Message contains out-of-bounds list pointer.\"",
                 (char (*) [45])"Message contains out-of-bounds list pointer.");
      kj::_::Debug::Fault::~Fault(&f_3);
      goto LAB_00348a4e;
    }
    p = (word *)(this + 1);
    KVar4 = WirePointer::kind(this);
    if (KVar4 != STRUCT) {
      kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[61]>
                ((Fault *)&wordsPerElement,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/layout.c++"
                 ,0x8e2,FAILED,"tag->kind() == WirePointer::STRUCT",
                 "\"INLINE_COMPOSITE lists of non-STRUCT type are not supported.\"",
                 (char (*) [61])"INLINE_COMPOSITE lists of non-STRUCT type are not supported.");
      kj::_::Debug::Fault::~Fault((Fault *)&wordsPerElement);
      goto LAB_00348a4e;
    }
    i = WirePointer::inlineCompositeListElementCount(this);
    WVar6 = WirePointer::StructRef::wordSize(&(this->field_1).structRef);
    uVar10 = upgradeBound<unsigned_long,unsigned_int>(i);
    if ((ulong)WVar5 <= uVar10 * WVar6 && uVar10 * WVar6 - (ulong)WVar5 != 0) {
      kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[57]>
                (&f_5,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/layout.c++"
                 ,0x8ea,FAILED,"upgradeBound<uint64_t>(size) * wordsPerElement <= wordCount",
                 "\"INLINE_COMPOSITE list\'s elements overrun its word count.\"",
                 (char (*) [57])"INLINE_COMPOSITE list\'s elements overrun its word count.");
      kj::_::Debug::Fault::~Fault(&f_5);
      goto LAB_00348a4e;
    }
    if ((WVar6 == 0) && (bVar1 = amplifiedRead((SegmentReader *)capTable_local,i), !bVar1)) {
      kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[41]>
                (&f_6,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/layout.c++"
                 ,0x8f2,FAILED,"amplifiedRead(segment, size * (ONE * WORDS / ELEMENTS))",
                 "\"Message contains amplified list pointer.\"",
                 (char (*) [41])"Message contains amplified list pointer.");
      kj::_::Debug::Fault::~Fault(&f_6);
      goto LAB_00348a4e;
    }
    if ((f.exception._7_1_ & 1) == 0) goto switchD_00348d89_default;
    switch(expectedElementSize) {
    case VOID:
    default:
switchD_00348d89_default:
      segment_00 = capTable_local;
      capTable_00 = ref_local;
      uVar3 = DirectWireValue<unsigned_short>::get(&(this->field_1).structRef.dataSize);
      structPointerCount = DirectWireValue<unsigned_short>::get(&(this->field_1).structRef.ptrCount)
      ;
      ListReader::ListReader
                (__return_storage_ptr__,(SegmentReader *)segment_00,(CapTableReader *)capTable_00,p,
                 i,WVar6 << 6,(uint)uVar3 << 6,structPointerCount,INLINE_COMPOSITE,nestingLimit + -1
                );
      return __return_storage_ptr__;
    case BIT:
      kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[106]>
                (&f_7,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/layout.c++"
                 ,0x905,FAILED,(char *)0x0,
                 "\"Found struct list where bit list was expected; upgrading boolean lists to structs \" \"is no longer supported.\""
                 ,(char (*) [106])
                  "Found struct list where bit list was expected; upgrading boolean lists to structs is no longer supported."
                );
      kj::_::Debug::Fault::~Fault(&f_7);
      break;
    case BYTE:
    case TWO_BYTES:
    case FOUR_BYTES:
    case EIGHT_BYTES:
      uVar3 = DirectWireValue<unsigned_short>::get(&(this->field_1).structRef.dataSize);
      if (uVar3 != 0) goto switchD_00348d89_default;
      kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[67]>
                (&f_8,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/layout.c++"
                 ,0x90f,FAILED,"tag->structRef.dataSize.get() > ZERO * WORDS",
                 "\"Expected a primitive list, but got a list of pointer-only structs.\"",
                 (char (*) [67])"Expected a primitive list, but got a list of pointer-only structs."
                );
      kj::_::Debug::Fault::~Fault(&f_8);
      break;
    case POINTER:
      uVar3 = DirectWireValue<unsigned_short>::get(&(this->field_1).structRef.dataSize);
      p = (word *)((WirePointer *)p + (int)(uint)uVar3);
      uVar3 = DirectWireValue<unsigned_short>::get(&(this->field_1).structRef.ptrCount);
      if (uVar3 != 0) goto switchD_00348d89_default;
      kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[62]>
                ((Fault *)&pointerCount,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/layout.c++"
                 ,0x91a,FAILED,"tag->structRef.ptrCount.get() > ZERO * POINTERS",
                 "\"Expected a pointer list, but got a list of data-only structs.\"",
                 (char (*) [62])"Expected a pointer list, but got a list of data-only structs.");
      kj::_::Debug::Fault::~Fault((Fault *)&pointerCount);
      break;
    case INLINE_COMPOSITE:
      goto switchD_00348d89_default;
    }
LAB_00348a4e:
    if ((pWStack_38 == (WirePointer *)0x0) || (bVar1 = WirePointer::isNull(pWStack_38), bVar1)) {
      ListReader::ListReader(__return_storage_ptr__,expectedElementSize);
      return __return_storage_ptr__;
    }
    capTable_local = (CapTableReader *)0x0;
    refTarget_local = (word *)pWStack_38;
    defaultValue_local = WirePointer::target(pWStack_38,(SegmentReader *)0x0);
    pWStack_38 = (WirePointer *)0x0;
  } while( true );
}

Assistant:

static KJ_ALWAYS_INLINE(ListReader readListPointer(
      SegmentReader* segment, CapTableReader* capTable,
      const WirePointer* ref, const word* refTarget,
      const word* defaultValue, ElementSize expectedElementSize, int nestingLimit,
      bool checkElementSize = true)) {
    if (ref->isNull()) {
    useDefault:
      if (defaultValue == nullptr ||
          reinterpret_cast<const WirePointer*>(defaultValue)->isNull()) {
        return ListReader(expectedElementSize);
      }
      segment = nullptr;
      ref = reinterpret_cast<const WirePointer*>(defaultValue);
      refTarget = ref->target(segment);
      defaultValue = nullptr;  // If the default value is itself invalid, don't use it again.
    }

    KJ_REQUIRE(nestingLimit > 0,
               "Message is too deeply-nested or contains cycles.  See capnp::ReaderOptions.") {
      goto useDefault;
    }

    const word* ptr;
    KJ_IF_MAYBE(p, followFars(ref, refTarget, segment)) {
      ptr = p;
    } else {
      goto useDefault;
    }

    KJ_REQUIRE(ref->kind() == WirePointer::LIST,
               "Message contains non-list pointer where list pointer was expected.") {
      goto useDefault;
    }

    ElementSize elementSize = ref->listRef.elementSize();
    if (elementSize == ElementSize::INLINE_COMPOSITE) {
      auto wordCount = ref->listRef.inlineCompositeWordCount();

      // An INLINE_COMPOSITE list points to a tag, which is formatted like a pointer.
      const WirePointer* tag = reinterpret_cast<const WirePointer*>(ptr);

      KJ_REQUIRE(boundsCheck(segment, ptr, wordCount + POINTER_SIZE_IN_WORDS),
                 "Message contains out-of-bounds list pointer.") {
        goto useDefault;
      }

      ptr += POINTER_SIZE_IN_WORDS;

      KJ_REQUIRE(tag->kind() == WirePointer::STRUCT,
                 "INLINE_COMPOSITE lists of non-STRUCT type are not supported.") {
        goto useDefault;
      }

      auto size = tag->inlineCompositeListElementCount();
      auto wordsPerElement = tag->structRef.wordSize() / ELEMENTS;

      KJ_REQUIRE(upgradeBound<uint64_t>(size) * wordsPerElement <= wordCount,
                 "INLINE_COMPOSITE list's elements overrun its word count.") {
        goto useDefault;
      }

      if (wordsPerElement * (ONE * ELEMENTS) == ZERO * WORDS) {
        // Watch out for lists of zero-sized structs, which can claim to be arbitrarily large
        // without having sent actual data.
        KJ_REQUIRE(amplifiedRead(segment, size * (ONE * WORDS / ELEMENTS)),
                   "Message contains amplified list pointer.") {
          goto useDefault;
        }
      }

      if (checkElementSize) {
        // If a struct list was not expected, then presumably a non-struct list was upgraded to a
        // struct list. We need to manipulate the pointer to point at the first field of the
        // struct. Together with the `step` field, this will allow the struct list to be accessed
        // as if it were a primitive list without branching.

        // Check whether the size is compatible.
        switch (expectedElementSize) {
          case ElementSize::VOID:
            break;

          case ElementSize::BIT:
            KJ_FAIL_REQUIRE(
                "Found struct list where bit list was expected; upgrading boolean lists to structs "
                "is no longer supported.") {
              goto useDefault;
            }
            break;

          case ElementSize::BYTE:
          case ElementSize::TWO_BYTES:
          case ElementSize::FOUR_BYTES:
          case ElementSize::EIGHT_BYTES:
            KJ_REQUIRE(tag->structRef.dataSize.get() > ZERO * WORDS,
                       "Expected a primitive list, but got a list of pointer-only structs.") {
              goto useDefault;
            }
            break;

          case ElementSize::POINTER:
            // We expected a list of pointers but got a list of structs.  Assuming the first field
            // in the struct is the pointer we were looking for, we want to munge the pointer to
            // point at the first element's pointer section.
            ptr += tag->structRef.dataSize.get();
            KJ_REQUIRE(tag->structRef.ptrCount.get() > ZERO * POINTERS,
                       "Expected a pointer list, but got a list of data-only structs.") {
              goto useDefault;
            }
            break;

          case ElementSize::INLINE_COMPOSITE:
            break;
        }
      }

      return ListReader(
          segment, capTable, ptr, size, wordsPerElement * BITS_PER_WORD,
          tag->structRef.dataSize.get() * BITS_PER_WORD,
          tag->structRef.ptrCount.get(), ElementSize::INLINE_COMPOSITE,
          nestingLimit - 1);

    } else {
      // This is a primitive or pointer list, but all such lists can also be interpreted as struct
      // lists.  We need to compute the data size and pointer count for such structs.
      auto dataSize = dataBitsPerElement(ref->listRef.elementSize()) * ELEMENTS;
      auto pointerCount = pointersPerElement(ref->listRef.elementSize()) * ELEMENTS;
      auto elementCount = ref->listRef.elementCount();
      auto step = (dataSize + pointerCount * BITS_PER_POINTER) / ELEMENTS;

      auto wordCount = roundBitsUpToWords(upgradeBound<uint64_t>(elementCount) * step);
      KJ_REQUIRE(boundsCheck(segment, ptr, wordCount),
            "Message contains out-of-bounds list pointer.") {
        goto useDefault;
      }

      if (elementSize == ElementSize::VOID) {
        // Watch out for lists of void, which can claim to be arbitrarily large without having sent
        // actual data.
        KJ_REQUIRE(amplifiedRead(segment, elementCount * (ONE * WORDS / ELEMENTS)),
                   "Message contains amplified list pointer.") {
          goto useDefault;
        }
      }

      if (checkElementSize) {
        if (elementSize == ElementSize::BIT && expectedElementSize != ElementSize::BIT) {
          KJ_FAIL_REQUIRE(
              "Found bit list where struct list was expected; upgrading boolean lists to structs "
              "is no longer supported.") {
            goto useDefault;
          }
        }

        // Verify that the elements are at least as large as the expected type.  Note that if we
        // expected INLINE_COMPOSITE, the expected sizes here will be zero, because bounds checking
        // will be performed at field access time.  So this check here is for the case where we
        // expected a list of some primitive or pointer type.

        BitCount expectedDataBitsPerElement =
            dataBitsPerElement(expectedElementSize) * ELEMENTS;
        WirePointerCount expectedPointersPerElement =
            pointersPerElement(expectedElementSize) * ELEMENTS;

        KJ_REQUIRE(expectedDataBitsPerElement <= dataSize,
                   "Message contained list with incompatible element type.") {
          goto useDefault;
        }
        KJ_REQUIRE(expectedPointersPerElement <= pointerCount,
                   "Message contained list with incompatible element type.") {
          goto useDefault;
        }
      }

      return ListReader(segment, capTable, ptr, elementCount, step,
                        dataSize, pointerCount, elementSize, nestingLimit - 1);
    }
  }